

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_const_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_const_reference_storage::value((json_const_reference_storage *)0x2b2aea);
    local_1 = is_array((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else if (jVar1 == json_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_reference_storage::value((json_reference_storage *)0x2b2b15);
    local_1 = is_array((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else if (jVar1 == array) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_array() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_array();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_array();
                default:
                    return false;
            }
        }